

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float64 float64_sqrt_ppc64(float64 xa,float_status *s)

{
  _Bool _Var1;
  long lVar2;
  ulong uVar3;
  float64 fVar4;
  FloatParts FVar5;
  union_float64 ur;
  union_float64 ua;
  float_status *s_local;
  float64 xa_local;
  FloatParts pr;
  FloatParts pa;
  ulong local_78;
  uint64_t t_frac;
  uint64_t q;
  int last_bit;
  int bit;
  uint64_t s_frac;
  uint64_t r_frac;
  uint64_t a_frac;
  int local_20;
  FloatClass FStack_1c;
  _Bool _Stack_1b;
  undefined2 uStack_1a;
  FloatParts local_18;
  
  FVar5 = float64_unpack_raw(xa);
  local_18 = sf_canonicalize(FVar5,&float64_params,s);
  local_78 = local_18.frac;
  local_20 = local_18.exp;
  FStack_1c = local_18.cls;
  _Stack_1b = local_18.sign;
  uStack_1a = local_18._14_2_;
  _Var1 = is_nan(FStack_1c);
  if (_Var1) {
    local_18 = return_nan(local_18,s);
  }
  else if (FStack_1c != float_class_zero) {
    if (((undefined1  [16])local_18 & (undefined1  [16])0x10000000000) == (undefined1  [16])0x0) {
      if (FStack_1c != float_class_inf) {
        if (FStack_1c != float_class_normal) {
          __assert_fail("a.cls == float_class_normal",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                        ,0xc5f,"FloatParts sqrt_float(FloatParts, float_status *, const FloatFmt *)"
                       );
        }
        r_frac = local_78;
        if (((undefined1  [16])local_18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          r_frac = local_78 >> 1;
        }
        s_frac = 0;
        _last_bit = 0;
        q._4_4_ = 0x3d;
        do {
          lVar2 = 1L << ((byte)q._4_4_ & 0x3f);
          uVar3 = _last_bit + lVar2;
          if (uVar3 <= r_frac) {
            _last_bit = uVar3 + lVar2;
            r_frac = r_frac - uVar3;
            s_frac = lVar2 + s_frac;
          }
          r_frac = r_frac << 1;
          q._4_4_ = q._4_4_ + -1;
        } while (5 < q._4_4_);
        local_18.cls = 2;
        local_18.exp = local_20 >> 1;
        local_18.sign = _Stack_1b;
        local_18._14_2_ = uStack_1a;
        local_18.frac = s_frac * 2 + (long)(int)(uint)(r_frac != 0);
      }
    }
    else {
      s->float_exception_flags = s->float_exception_flags | 1;
      local_18 = parts_default_nan(s);
    }
  }
  FVar5 = round_canonical(local_18,s,&float64_params);
  fVar4 = float64_pack_raw(FVar5);
  return fVar4;
}

Assistant:

float64 QEMU_FLATTEN float64_sqrt(float64 xa, float_status *s)
{
    union_float64 ua, ur;

    ua.s = xa;
    if (unlikely(!can_use_fpu(s))) {
        goto soft;
    }

    float64_input_flush1(&ua.s, s);
    if (QEMU_HARDFLOAT_1F64_USE_FP) {
        if (unlikely(!(fpclassify(ua.h) == FP_NORMAL ||
                       fpclassify(ua.h) == FP_ZERO) ||
                     signbit(ua.h))) {
            goto soft;
        }
    } else if (unlikely(!float64_is_zero_or_normal(ua.s) ||
                        float64_is_neg(ua.s))) {
        goto soft;
    }
    ur.h = sqrt(ua.h);
    return ur.s;

 soft:
    return soft_f64_sqrt(ua.s, s);
}